

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void ncnn::resize_bilinear_image(Mat *src,Mat *dst,int w,int h)

{
  size_t __size;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  long lVar9;
  int *piVar10;
  void *pvVar11;
  undefined8 *puVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  float *rows1p;
  ulong uVar17;
  void *pvVar18;
  ulong uVar19;
  ulong uVar20;
  float *rows0p;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  ulong local_a0;
  ulong local_98;
  int *local_60;
  
  iVar7 = src->w;
  iVar3 = src->h;
  uVar5 = h * 3 + w * 3;
  uVar19 = 0xffffffffffffffff;
  if (-1 < (int)uVar5) {
    uVar19 = (ulong)uVar5 * 4;
  }
  pvVar8 = operator_new__(uVar19);
  lVar13 = (long)w;
  lVar9 = (long)h;
  uVar19 = (ulong)(uint)w;
  if (0 < w) {
    lVar15 = lVar9 * 4 + lVar13 * 4;
    uVar17 = 0;
    do {
      fVar25 = ((float)(int)uVar17 + 0.5) * (float)iVar7 * (1.0 / (float)w) + -0.5;
      fVar24 = floorf(fVar25);
      iVar6 = (int)fVar24;
      fVar26 = 0.0;
      bVar23 = -1 < iVar6;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      if (bVar23) {
        fVar26 = fVar25 - (float)(int)fVar24;
      }
      if (iVar7 + -1 <= iVar6) {
        fVar26 = 1.0;
        iVar6 = iVar7 + -2;
      }
      *(int *)((long)pvVar8 + uVar17 * 4) = iVar6;
      *(float *)((long)pvVar8 + uVar17 * 8 + lVar15) = 1.0 - fVar26;
      *(float *)((long)pvVar8 + uVar17 * 8 + lVar15 + 4) = fVar26;
      uVar17 = uVar17 + 1;
    } while (uVar19 != uVar17);
  }
  if (0 < h) {
    lVar15 = (long)(w * 2) * 4 + lVar9 * 4 + lVar13 * 4;
    uVar17 = 0;
    do {
      fVar25 = ((float)(int)uVar17 + 0.5) * (float)iVar3 * (1.0 / (float)h) + -0.5;
      fVar24 = floorf(fVar25);
      iVar7 = (int)fVar24;
      fVar26 = 0.0;
      bVar23 = -1 < iVar7;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      if (bVar23) {
        fVar26 = fVar25 - (float)(int)fVar24;
      }
      if (iVar3 + -1 <= iVar7) {
        fVar26 = 1.0;
        iVar7 = iVar3 + -2;
      }
      *(int *)((long)pvVar8 + uVar17 * 4 + lVar13 * 4) = iVar7;
      *(float *)((long)pvVar8 + uVar17 * 8 + lVar15) = 1.0 - fVar26;
      *(float *)((long)pvVar8 + uVar17 * 8 + lVar15 + 4) = fVar26;
      uVar17 = uVar17 + 1;
    } while ((uint)h != uVar17);
  }
  if (w + 1 == 0) {
    local_60 = (int *)0x0;
    local_98 = 0;
    piVar10 = (int *)0x0;
    local_a0 = 0;
  }
  else {
    lVar15 = (long)(w + 1);
    __size = lVar15 * 4 + 0x1c;
    pvVar11 = malloc(__size);
    local_98 = (long)pvVar11 + 0x17U & 0xfffffffffffffff0;
    *(void **)(local_98 - 8) = pvVar11;
    local_60 = (int *)(local_98 + lVar15 * 4);
    *local_60 = 1;
    pvVar11 = malloc(__size);
    local_a0 = (long)pvVar11 + 0x17U & 0xfffffffffffffff0;
    *(void **)(local_a0 - 8) = pvVar11;
    piVar10 = (int *)(local_a0 + lVar15 * 4);
    *piVar10 = 1;
  }
  if (0 < h) {
    puVar12 = (undefined8 *)((long)pvVar8 + (long)(w * 2) * 4 + lVar9 * 4 + lVar13 * 4);
    pvVar11 = src->data;
    iVar7 = src->w;
    pvVar18 = dst->data;
    iVar3 = dst->w;
    lVar9 = lVar9 * 4 + lVar13 * 4;
    iVar6 = -1;
    uVar20 = 0;
    uVar17 = local_a0;
    uVar21 = local_98;
    do {
      iVar4 = *(int *)((long)pvVar8 + uVar20 * 4 + lVar13 * 4);
      if (iVar4 == iVar6) {
        uVar16 = uVar21;
        uVar22 = uVar17;
        if (0 < w) {
          uVar17 = 0;
          do {
            uVar1 = *(undefined8 *)((long)pvVar8 + uVar17 * 8 + lVar9);
            uVar2 = *(undefined8 *)
                     ((long)pvVar11 +
                     (long)*(int *)((long)pvVar8 + uVar17 * 4) * 4 + (long)((iVar6 + 1) * iVar7) * 4
                     );
            *(float *)(uVar21 + uVar17 * 4) =
                 (float)((ulong)uVar2 >> 0x20) * (float)((ulong)uVar1 >> 0x20) +
                 (float)uVar2 * (float)uVar1;
            uVar17 = uVar17 + 1;
          } while (uVar19 != uVar17);
        }
      }
      else {
        uVar16 = uVar17;
        uVar22 = uVar21;
        if (0 < w) {
          uVar14 = 0;
          do {
            lVar15 = (long)*(int *)((long)pvVar8 + uVar14 * 4);
            uVar1 = *(undefined8 *)((long)pvVar8 + uVar14 * 8 + lVar9);
            uVar2 = *(undefined8 *)((long)pvVar11 + lVar15 * 4 + (long)(iVar7 * iVar4) * 4);
            fVar25 = (float)uVar1;
            fVar24 = (float)((ulong)uVar1 >> 0x20);
            *(float *)(uVar21 + uVar14 * 4) =
                 (float)((ulong)uVar2 >> 0x20) * fVar24 + (float)uVar2 * fVar25;
            uVar1 = *(undefined8 *)((long)pvVar11 + lVar15 * 4 + (long)((iVar4 + 1) * iVar7) * 4);
            *(float *)(uVar17 + uVar14 * 4) =
                 (float)((ulong)uVar1 >> 0x20) * fVar24 + (float)uVar1 * fVar25;
            uVar14 = uVar14 + 1;
          } while (uVar19 != uVar14);
        }
      }
      if (w != 0) {
        uVar1 = *puVar12;
        lVar15 = 0;
        do {
          *(float *)((long)pvVar18 + lVar15 * 4) =
               *(float *)(uVar16 + lVar15 * 4) * (float)((ulong)uVar1 >> 0x20) +
               *(float *)(uVar22 + lVar15 * 4) * (float)uVar1;
          lVar15 = lVar15 + 1;
        } while (w != (int)lVar15);
      }
      iVar6 = iVar4 + 1;
      puVar12 = puVar12 + 1;
      uVar20 = uVar20 + 1;
      pvVar18 = (void *)((long)pvVar18 + (long)iVar3 * 4);
      uVar17 = uVar16;
      uVar21 = uVar22;
    } while (uVar20 != (uint)h);
  }
  operator_delete__(pvVar8);
  if (piVar10 != (int *)0x0) {
    LOCK();
    iVar7 = *piVar10;
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if ((local_a0 != 0) && (iVar7 == 1)) {
      free(*(void **)(local_a0 - 8));
    }
  }
  if (local_60 != (int *)0x0) {
    LOCK();
    *local_60 = *local_60 + -1;
    UNLOCK();
    if (local_98 != 0 && *local_60 == 0) {
      free(*(void **)(local_98 - 8));
      return;
    }
  }
  return;
}

Assistant:

static void resize_bilinear_image(const Mat& src, Mat& dst, int w, int h)
{
    double scale_x = (double)src.w / w;
    double scale_y = (double)src.h / h;

    int* buf = new int[w + h + w*2 + h*2];

    int* xofs = buf;//new int[w];
    int* yofs = buf + w;//new int[h];

    float* alpha = (float*)(buf + w + h);//new float[w * 2];
    float* beta = (float*)(buf + w + h + w*2);//new float[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = floor(fx);
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= src.w - 1)
        {
            sx = src.w - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        alpha[dx*2    ] = 1.f - fx;
        alpha[dx*2 + 1] = fx;
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = floor(fy);
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= src.h - 1)
        {
            sy = src.h - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        beta[dy*2    ] = 1.f - fy;
        beta[dy*2 + 1] = fy;
    }

    // loop body
    Mat rowsbuf0(w + 1);
    Mat rowsbuf1(w + 1);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;

    int prev_sy1 = -1;

    for (int dy = 0; dy < h; dy++ )
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const float* S1 = src.row(sy+1);

            const float* alphap = alpha;
            float* rows1p = rows1;
            int dx = 0;
#if __ARM_NEON
            for ( ; dx+1 < w; dx += 2 )
            {
                int sx = xofs[dx];
                int sxn = xofs[dx+1];
                const float* S1p = S1 + sx;
                const float* S1np = S1 + sxn;

                float32x4_t _a = vld1q_f32(alphap);
                float32x2_t _S1 = vld1_f32(S1p);
                float32x2_t _S1n = vld1_f32(S1np);

                float32x4_t _S1S1n = vcombine_f32(_S1, _S1n);
                float32x4_t _ms1 = vmulq_f32(_S1S1n, _a);
                float32x2_t _rows1 = vpadd_f32(vget_low_f32(_ms1), vget_high_f32(_ms1));

                vst1_f32(rows1p + dx, _rows1);

                alphap += 4;
            }
#endif // __ARM_NEON
            for ( ; dx < w; dx++ )
            {
                int sx = xofs[dx];
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows1p[dx] = S1p[0]*a0 + S1p[1]*a1;

                alphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const float* S0 = src.row(sy);
            const float* S1 = src.row(sy+1);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            int dx = 0;
#if __ARM_NEON
            for ( ; dx+1 < w; dx += 2 )
            {
                int sx = xofs[dx];
                int sxn = xofs[dx+1];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;
                const float* S0np = S0 + sxn;
                const float* S1np = S1 + sxn;

                float32x4_t _a = vld1q_f32(alphap);
                float32x2_t _S0 = vld1_f32(S0p);
                float32x2_t _S1 = vld1_f32(S1p);
                float32x2_t _S0n = vld1_f32(S0np);
                float32x2_t _S1n = vld1_f32(S1np);

                float32x4_t _S0S0n = vcombine_f32(_S0, _S0n);
                float32x4_t _S1S1n = vcombine_f32(_S1, _S1n);
                float32x4_t _ms0 = vmulq_f32(_S0S0n, _a);
                float32x4_t _ms1 = vmulq_f32(_S1S1n, _a);
                float32x2_t _rows0 = vpadd_f32(vget_low_f32(_ms0), vget_high_f32(_ms0));
                float32x2_t _rows1 = vpadd_f32(vget_low_f32(_ms1), vget_high_f32(_ms1));

                vst1_f32(rows0p + dx, _rows0);
                vst1_f32(rows1p + dx, _rows1);

                alphap += 4;
            }
#endif // __ARM_NEON
            for ( ; dx < w; dx++ )
            {
                int sx = xofs[dx];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows0p[dx] = S0p[0]*a0 + S0p[1]*a1;
                rows1p[dx] = S1p[0]*a0 + S1p[1]*a1;

                alphap += 2;
            }
        }

        prev_sy1 = sy + 1;

        // vresize
        float b0 = beta[0];
        float b1 = beta[1];

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* Dp = dst.row(dy);

#if __ARM_NEON
        int nn = w >> 3;
#else
        int nn = 0;
#endif
        int remain = w - (nn << 3);

#if __ARM_NEON
        float32x4_t _b0 = vdupq_n_f32(b0);
        float32x4_t _b1 = vdupq_n_f32(b1);
        for (; nn>0; nn--)
        {
            float32x4_t _rows0 = vld1q_f32(rows0p);
            float32x4_t _rows1 = vld1q_f32(rows1p);

            float32x4_t _D = vmulq_f32(_rows0, _b0);
            _D = vmlaq_f32(_D, _rows1, _b1);

            vst1q_f32(Dp, _D);

            float32x4_t _rows0n = vld1q_f32(rows0p+4);
            float32x4_t _rows1n = vld1q_f32(rows1p+4);

            float32x4_t _Dn = vmulq_f32(_rows0n, _b0);
            _Dn = vmlaq_f32(_Dn, _rows1n, _b1);

            vst1q_f32(Dp+4, _Dn);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
        }
#endif // __ARM_NEON
        for ( ; remain; --remain )
        {
//             D[x] = rows0[x]*b0 + rows1[x]*b1;
            *Dp++ = *rows0p++ * b0 + *rows1p++ * b1;
        }

        beta += 2;
    }

    delete[] buf;
}